

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.hpp
# Opt level: O2

void __thiscall
duckdb::ColumnReader::
PlainTemplatedInternal<int,duckdb::TemplatedParquetValueConversion<long>,false,false>
          (ColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,uint64_t num_values,
          idx_t result_offset,Vector *result)

{
  undefined4 uVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  uint64_t uVar4;
  idx_t row_idx;
  ulong uVar5;
  
  pdVar2 = result->data;
  FlatVector::VerifyFlatVector(result);
  uVar5 = num_values + result_offset;
  uVar4 = plain_data->len;
  pdVar3 = plain_data->ptr;
  while( true ) {
    uVar4 = uVar4 - 8;
    if (uVar5 <= result_offset) break;
    uVar1 = *(undefined4 *)pdVar3;
    plain_data->len = uVar4;
    plain_data->ptr = pdVar3 + 8;
    *(undefined4 *)(pdVar2 + result_offset * 4) = uVar1;
    result_offset = result_offset + 1;
    pdVar3 = pdVar3 + 8;
  }
  return;
}

Assistant:

void PlainTemplatedInternal(ByteBuffer &plain_data, const uint8_t *__restrict defines, const uint64_t num_values,
	                            const idx_t result_offset, Vector &result) {
		const auto result_ptr = FlatVector::GetData<VALUE_TYPE>(result);
		if (!HAS_DEFINES && !CHECKED && CONVERSION::PlainConstantSize() == sizeof(VALUE_TYPE)) {
			// we can memcpy
			idx_t copy_count = num_values * CONVERSION::PlainConstantSize();
			memcpy(result_ptr + result_offset, plain_data.ptr, copy_count);
			plain_data.unsafe_inc(copy_count);
			return;
		}
		auto &result_mask = FlatVector::Validity(result);
		for (idx_t row_idx = result_offset; row_idx < result_offset + num_values; row_idx++) {
			if (HAS_DEFINES && defines[row_idx] != MaxDefine()) {
				result_mask.SetInvalid(row_idx);
				continue;
			}
			result_ptr[row_idx] = CONVERSION::template PlainRead<CHECKED>(plain_data, *this);
		}
	}